

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O3

resource loader::exe_reader::find_resource
                   (istream *is,uint32_t name,uint32_t type,uint32_t language)

{
  BinaryType BVar1;
  resource rVar2;
  ulong uVar3;
  
  BVar1 = anon_unknown_0::determine_binary_type(is);
  if (BVar1 == PEMagic) {
    rVar2 = anon_unknown_0::pe_reader::find_resource(is,name,type,language);
  }
  else {
    if (BVar1 != OS2Magic) {
      rVar2.offset = 0;
      rVar2.size = 0;
      uVar3 = 0;
      goto LAB_00132dfc;
    }
    rVar2 = anon_unknown_0::ne_reader::find_resource(is,name,type);
  }
  uVar3 = (ulong)rVar2 & 0xffffffff00000000;
LAB_00132dfc:
  return (resource)((ulong)rVar2 & 0xffffffff | uVar3);
}

Assistant:

exe_reader::resource exe_reader::find_resource(std::istream & is, boost::uint32_t name,
                                               boost::uint32_t type,
                                               boost::uint32_t language) {
	
	BinaryType bintype = determine_binary_type(is);
	switch(bintype) {
		case OS2Magic: return ne_reader::find_resource(is, name, type);
		case PEMagic:  return pe_reader::find_resource(is, name, type, language);
		default: {
			resource result;
			result.offset = result.size = 0;
			return result;
		}
	}
	
}